

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::SupportVectorRegressor::_InternalSerialize
          (SupportVectorRegressor *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  ulong uVar3;
  
  if ((this != (SupportVectorRegressor *)_SupportVectorRegressor_default_instance_) &&
     (this->kernel_ != (Kernel *)0x0)) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::Kernel>(1,this->kernel_,puVar1,stream);
  }
  uVar2 = this->_oneof_case_[0];
  if (uVar2 == 2) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::SparseSupportVectors>
                       (2,(this->supportVectors_).sparsesupportvectors_,puVar1,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 3) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::DenseSupportVectors>
                       (3,(this->supportVectors_).densesupportvectors_,puVar1,stream);
  }
  if ((this != (SupportVectorRegressor *)_SupportVectorRegressor_default_instance_) &&
     (this->coefficients_ != (Coefficients *)0x0)) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::Coefficients>
                       (4,this->coefficients_,puVar1,stream);
  }
  if (this->rho_ != 0.0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteDoubleToArray(5,this->rho_,puVar1);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) == 0) {
    return target;
  }
  uVar3 = uVar3 & 0xfffffffffffffffc;
  puVar1 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar3 + 8),*(int *)(uVar3 + 0x10),target);
  return puVar1;
}

Assistant:

uint8_t* SupportVectorRegressor::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.SupportVectorRegressor)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Kernel kernel = 1;
  if (this->_internal_has_kernel()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::kernel(this), target, stream);
  }

  // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 2;
  if (_internal_has_sparsesupportvectors()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::sparsesupportvectors(this), target, stream);
  }

  // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 3;
  if (_internal_has_densesupportvectors()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::densesupportvectors(this), target, stream);
  }

  // .CoreML.Specification.Coefficients coefficients = 4;
  if (this->_internal_has_coefficients()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        4, _Internal::coefficients(this), target, stream);
  }

  // double rho = 5;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_rho = this->_internal_rho();
  uint64_t raw_rho;
  memcpy(&raw_rho, &tmp_rho, sizeof(tmp_rho));
  if (raw_rho != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(5, this->_internal_rho(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.SupportVectorRegressor)
  return target;
}